

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int State_insert(state *data,config *key)

{
  config **ppcVar1;
  action *paVar2;
  size_t __nmemb;
  s_x3 *psVar3;
  int iVar4;
  int iVar5;
  config *pcVar6;
  s_x3node *psVar7;
  long lVar8;
  state *psVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  s_x3node *__ptr;
  config *pcVar13;
  state *psVar14;
  long lVar15;
  s_x3node *psVar16;
  
  psVar3 = x3a;
  if (x3a == (s_x3 *)0x0) {
LAB_0010392c:
    iVar5 = 0;
  }
  else {
    uVar11 = 0;
    pcVar6 = key;
    if (key != (config *)0x0) {
      do {
        uVar11 = pcVar6->rp->index * 0x25 + uVar11 * 0x23b + pcVar6->dot;
        ppcVar1 = &pcVar6->bp;
        pcVar6 = *ppcVar1;
      } while (*ppcVar1 != (config *)0x0);
    }
    iVar5 = x3a->size;
    uVar10 = (ulong)(iVar5 - 1U & uVar11);
    psVar16 = (s_x3node *)x3a->ht;
    for (psVar14 = (&psVar16->data)[uVar10]; psVar14 != (state *)0x0;
        psVar14 = *(state **)&psVar14->statenum) {
      iVar4 = statecmp(psVar14->cfp,key);
      if (iVar4 == 0) goto LAB_0010392c;
    }
    iVar4 = psVar3->count;
    lVar15 = (long)iVar4;
    if (iVar4 < iVar5) {
      psVar7 = psVar3->tbl;
    }
    else {
      __nmemb = (long)iVar5 * 2;
      psVar7 = (s_x3node *)calloc(__nmemb,0x28);
      if (psVar7 == (s_x3node *)0x0) goto LAB_0010392c;
      psVar16 = psVar7 + (long)iVar5 * 2;
      iVar5 = (int)__nmemb;
      if (iVar4 < 1) {
        __ptr = psVar3->tbl;
      }
      else {
        __ptr = psVar3->tbl;
        lVar8 = 0;
        do {
          pcVar6 = __ptr[lVar8].key;
          uVar12 = 0;
          if (pcVar6 != (config *)0x0) {
            uVar12 = 0;
            pcVar13 = pcVar6;
            do {
              uVar12 = pcVar13->rp->index * 0x25 + uVar12 * 0x23b + pcVar13->dot;
              pcVar13 = pcVar13->bp;
            } while (pcVar13 != (config *)0x0);
          }
          psVar14 = (state *)(psVar7 + lVar8);
          paVar2 = (action *)(&psVar16->data + (uVar12 & iVar5 - 1U));
          if ((state *)paVar2->sp == (state *)0x0) {
            psVar9 = (state *)0x0;
          }
          else {
            ((state *)paVar2->sp)->ap = (action *)&psVar14->statenum;
            psVar9 = (state *)paVar2->sp;
          }
          *(state **)&psVar14->statenum = psVar9;
          psVar14->cfp = pcVar6;
          psVar14->bp = (config *)__ptr[lVar8].data;
          psVar14->ap = paVar2;
          paVar2->sp = (symbol *)psVar14;
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar15);
      }
      free(__ptr);
      psVar3->size = iVar5;
      psVar3->tbl = psVar7;
      psVar3->ht = (s_x3node **)psVar16;
      uVar10 = (ulong)(iVar5 - 1U & uVar11);
    }
    psVar3->count = iVar4 + 1;
    psVar14 = (state *)(psVar7 + lVar15);
    psVar7[lVar15].key = key;
    psVar7[lVar15].data = data;
    if ((&psVar16->data)[uVar10] == (state *)0x0) {
      psVar9 = (state *)0x0;
    }
    else {
      (&psVar16->data)[uVar10]->ap = (action *)&psVar14->statenum;
      psVar9 = (&psVar16->data)[uVar10];
    }
    *(state **)&psVar14->statenum = psVar9;
    (&psVar16->data)[uVar10] = psVar14;
    psVar14->ap = (action *)(psVar3->ht + uVar10);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int State_insert(struct state *data, struct config *key)
{
  x3node *np;
  unsigned h;
  unsigned ph;

  if( x3a==0 ) return 0;
  ph = statehash(key);
  h = ph & (x3a->size-1);
  np = x3a->ht[h];
  while( np ){
    if( statecmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x3a->count>=x3a->size ){
    /* Need to make the hash table bigger */
    int i,arrSize;
    struct s_x3 array;
    array.size = arrSize = x3a->size*2;
    array.count = x3a->count;
    array.tbl = (x3node*)calloc(arrSize, sizeof(x3node) + sizeof(x3node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x3node**)&(array.tbl[arrSize]);
    for(i=0; i<arrSize; i++) array.ht[i] = 0;
    for(i=0; i<x3a->count; i++){
      x3node *oldnp, *newnp;
      oldnp = &(x3a->tbl[i]);
      h = statehash(oldnp->key) & (arrSize-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x3a->tbl);
    *x3a = array;
  }
  /* Insert the new data */
  h = ph & (x3a->size-1);
  np = &(x3a->tbl[x3a->count++]);
  np->key = key;
  np->data = data;
  if( x3a->ht[h] ) x3a->ht[h]->from = &(np->next);
  np->next = x3a->ht[h];
  x3a->ht[h] = np;
  np->from = &(x3a->ht[h]);
  return 1;
}